

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O0

LogStream * __thiscall sznet::LogStream::operator<<(LogStream *this,void *p)

{
  int iVar1;
  char *pcVar2;
  size_t len_00;
  size_t len;
  char *buf;
  uintptr_t i;
  void *p_local;
  LogStream *this_local;
  
  iVar1 = detail::FixedBuffer<4000>::avail(&this->m_buffer);
  if (0x20 < iVar1) {
    pcVar2 = detail::FixedBuffer<4000>::current(&this->m_buffer);
    *pcVar2 = '0';
    pcVar2[1] = 'x';
    len_00 = detail::convertHex(pcVar2 + 2,(uintptr_t)p);
    detail::FixedBuffer<4000>::add(&this->m_buffer,len_00);
  }
  return this;
}

Assistant:

LogStream& LogStream::operator<<(const void* p)
{
	// convert to number
	uintptr_t i = reinterpret_cast<uintptr_t>(p);
	if (m_buffer.avail() > kMaxNumericSize)
	{
		char * buf = m_buffer.current();
		buf[0] = '0';
		buf[1] = 'x';
		size_t len = detail::convertHex(buf + 2, i);
		m_buffer.add(len);
	}
	return *this;
}